

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::avx::FlatLinearCurveMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  long lVar27;
  ulong uVar28;
  Scene *pSVar29;
  undefined4 uVar30;
  long lVar31;
  ulong uVar32;
  float fVar33;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar45 [32];
  float fVar50;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar54;
  float fVar55;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar85 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  int local_334;
  Scene *local_330;
  Ray *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  RayQueryContext *local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  RTCFilterFunctionNArguments local_2d0;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pSVar29 = context->scene;
  uVar2 = line->sharedGeomID;
  uVar3 = (line->v0).field_0.i[0];
  local_2d8 = (ulong)uVar3;
  pGVar11 = (pSVar29->geometries).items[uVar2].ptr;
  fVar43 = (pGVar11->time_range).lower;
  fVar43 = pGVar11->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar43) / ((pGVar11->time_range).upper - fVar43));
  auVar44 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
  auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar44 = vmaxss_avx(ZEXT816(0),auVar44);
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar27 = (long)(int)auVar44._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar27);
  lVar31 = *(long *)(lVar12 + 0x10 + lVar27);
  uVar4 = (line->v0).field_0.i[4];
  local_2e0 = (ulong)uVar4;
  auVar85._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * local_2e0);
  auVar85._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * local_2d8);
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar31 * (ulong)uVar8);
  uStack_210 = *puVar1;
  _local_220 = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)uVar5);
  uStack_208 = puVar1[1];
  uVar9 = (line->v0).field_0.i[6];
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)uVar9);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)uVar6);
  uVar10 = (line->v0).field_0.i[7];
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)uVar10);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)uVar7);
  uVar28 = (ulong)(uVar3 + 1);
  uVar32 = (ulong)(uVar4 + 1);
  puVar1 = (undefined8 *)(lVar13 + lVar31 * uVar32);
  uStack_1f0 = *puVar1;
  _local_200 = *(undefined1 (*) [16])(lVar13 + lVar31 * uVar28);
  uStack_1e8 = puVar1[1];
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar8 + 1));
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar5 + 1));
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar9 + 1));
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar6 + 1));
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar10 + 1));
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar31 * (ulong)(uVar7 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar27);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar27);
  auVar86._16_16_ = *(undefined1 (*) [16])(lVar13 + local_2e0 * lVar12);
  auVar86._0_16_ = *(undefined1 (*) [16])(lVar13 + local_2d8 * lVar12);
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar12);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar94._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar94._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar96._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * lVar12);
  auVar96._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar12);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar13 + uVar32 * lVar12);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar13 + uVar28 * lVar12);
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * lVar12);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  fVar43 = fVar43 - auVar44._0_4_;
  auVar18 = vunpcklps_avx(auVar85,auVar68);
  auVar16 = vunpckhps_avx(auVar85,auVar68);
  auVar95 = vunpcklps_avx(_local_220,auVar70);
  auVar17 = vunpckhps_avx(_local_220,auVar70);
  auVar19 = vunpcklps_avx(auVar18,auVar95);
  auVar18 = vunpckhps_avx(auVar18,auVar95);
  auVar34 = vunpcklps_avx(auVar16,auVar17);
  auVar16 = vunpckhps_avx(auVar16,auVar17);
  auVar20 = vunpcklps_avx(_local_200,auVar76);
  auVar17 = vunpckhps_avx(_local_200,auVar76);
  auVar21 = vunpcklps_avx(auVar74,auVar78);
  auVar95 = vunpckhps_avx(auVar74,auVar78);
  _local_200 = vunpcklps_avx(auVar20,auVar21);
  auVar20 = vunpckhps_avx(auVar20,auVar21);
  auVar35 = vunpcklps_avx(auVar17,auVar95);
  auVar17 = vunpckhps_avx(auVar17,auVar95);
  auVar22 = vunpcklps_avx(auVar86,auVar94);
  auVar95 = vunpckhps_avx(auVar86,auVar94);
  auVar23 = vunpcklps_avx(auVar92,auVar96);
  auVar21 = vunpckhps_avx(auVar92,auVar96);
  auVar45 = vunpcklps_avx(auVar22,auVar23);
  auVar22 = vunpckhps_avx(auVar22,auVar23);
  auVar46 = vunpcklps_avx(auVar95,auVar21);
  auVar95 = vunpckhps_avx(auVar95,auVar21);
  auVar24 = vunpcklps_avx(auVar64,auVar56);
  auVar21 = vunpckhps_avx(auVar64,auVar56);
  lVar31 = lVar12 * (ulong)(uVar10 + 1);
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar12);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar31);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar47 = vunpcklps_avx(auVar65,auVar87);
  auVar23 = vunpckhps_avx(auVar65,auVar87);
  auVar56 = vunpcklps_avx(auVar24,auVar47);
  auVar24 = vunpckhps_avx(auVar24,auVar47);
  auVar47 = vunpcklps_avx(auVar21,auVar23);
  auVar21 = vunpckhps_avx(auVar21,auVar23);
  auVar44 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
  auVar15 = vshufps_avx(ZEXT416((uint)(1.0 - fVar43)),ZEXT416((uint)(1.0 - fVar43)),0);
  fVar38 = auVar44._0_4_;
  fVar39 = auVar44._4_4_;
  fVar40 = auVar44._8_4_;
  fVar41 = auVar44._12_4_;
  fVar43 = auVar15._0_4_;
  fVar33 = auVar15._4_4_;
  fVar36 = auVar15._8_4_;
  fVar37 = auVar15._12_4_;
  fStack_1a4 = auVar19._28_4_;
  fVar54 = fVar43 * auVar19._0_4_ + fVar38 * auVar45._0_4_;
  fStack_29c = fVar33 * auVar19._4_4_ + fVar39 * auVar45._4_4_;
  fStack_298 = fVar36 * auVar19._8_4_ + fVar40 * auVar45._8_4_;
  fStack_294 = fVar37 * auVar19._12_4_ + fVar41 * auVar45._12_4_;
  fStack_290 = fVar43 * auVar19._16_4_ + fVar38 * auVar45._16_4_;
  fStack_28c = fVar33 * auVar19._20_4_ + fVar39 * auVar45._20_4_;
  fStack_288 = fVar36 * auVar19._24_4_ + fVar40 * auVar45._24_4_;
  fStack_284 = fStack_1a4 + 0.0;
  auVar75._0_4_ = fVar43 * auVar18._0_4_ + fVar38 * auVar22._0_4_;
  auVar75._4_4_ = fVar33 * auVar18._4_4_ + fVar39 * auVar22._4_4_;
  auVar75._8_4_ = fVar36 * auVar18._8_4_ + fVar40 * auVar22._8_4_;
  auVar75._12_4_ = fVar37 * auVar18._12_4_ + fVar41 * auVar22._12_4_;
  auVar75._16_4_ = fVar43 * auVar18._16_4_ + fVar38 * auVar22._16_4_;
  auVar75._20_4_ = fVar33 * auVar18._20_4_ + fVar39 * auVar22._20_4_;
  auVar75._24_4_ = fVar36 * auVar18._24_4_ + fVar40 * auVar22._24_4_;
  auVar75._28_4_ = fStack_284 + auVar22._28_4_;
  local_1e0._0_4_ = fVar43 * auVar34._0_4_ + fVar38 * auVar46._0_4_;
  local_1e0._4_4_ = fVar33 * auVar34._4_4_ + fVar39 * auVar46._4_4_;
  local_1e0._8_4_ = fVar36 * auVar34._8_4_ + fVar40 * auVar46._8_4_;
  local_1e0._12_4_ = fVar37 * auVar34._12_4_ + fVar41 * auVar46._12_4_;
  local_1e0._16_4_ = fVar43 * auVar34._16_4_ + fVar38 * auVar46._16_4_;
  local_1e0._20_4_ = fVar33 * auVar34._20_4_ + fVar39 * auVar46._20_4_;
  local_1e0._24_4_ = fVar36 * auVar34._24_4_ + fVar40 * auVar46._24_4_;
  local_1e0._28_4_ = fStack_284 + auVar46._28_4_;
  local_220._0_4_ = auVar16._0_4_;
  local_220._4_4_ = auVar16._4_4_;
  fStack_218 = auVar16._8_4_;
  fStack_214 = auVar16._12_4_;
  uStack_210._0_4_ = auVar16._16_4_;
  uStack_210._4_4_ = auVar16._20_4_;
  uStack_208._0_4_ = auVar16._24_4_;
  local_220._0_4_ = fVar43 * (float)local_220._0_4_ + fVar38 * auVar95._0_4_;
  local_220._4_4_ = fVar33 * (float)local_220._4_4_ + fVar39 * auVar95._4_4_;
  fStack_218 = fVar36 * fStack_218 + fVar40 * auVar95._8_4_;
  fStack_214 = fVar37 * fStack_214 + fVar41 * auVar95._12_4_;
  uStack_210._0_4_ = fVar43 * (float)uStack_210 + fVar38 * auVar95._16_4_;
  uStack_210._4_4_ = fVar33 * uStack_210._4_4_ + fVar39 * auVar95._20_4_;
  uStack_208._0_4_ = fVar36 * (float)uStack_208 + fVar40 * auVar95._24_4_;
  uStack_208._4_4_ = auVar18._28_4_ + fStack_1a4;
  auVar44._0_4_ = fVar38 * auVar21._0_4_;
  auVar44._4_4_ = fVar39 * auVar21._4_4_;
  auVar44._8_4_ = fVar40 * auVar21._8_4_;
  auVar44._12_4_ = fVar41 * auVar21._12_4_;
  fVar48 = auVar45._28_4_;
  local_1a0 = fVar43 * (float)local_200._0_4_ + fVar38 * auVar56._0_4_;
  fStack_19c = fVar33 * (float)local_200._4_4_ + fVar39 * auVar56._4_4_;
  fStack_198 = fVar36 * fStack_1f8 + fVar40 * auVar56._8_4_;
  fStack_194 = fVar37 * fStack_1f4 + fVar41 * auVar56._12_4_;
  fStack_190 = fVar43 * (float)uStack_1f0 + fVar38 * auVar56._16_4_;
  fStack_18c = fVar33 * uStack_1f0._4_4_ + fVar39 * auVar56._20_4_;
  fStack_188 = fVar36 * (float)uStack_1e8 + fVar40 * auVar56._24_4_;
  fStack_184 = fVar48 + auVar56._28_4_;
  local_280._0_4_ = auVar20._0_4_;
  local_280._4_4_ = auVar20._4_4_;
  fStack_278 = auVar20._8_4_;
  fStack_274 = auVar20._12_4_;
  fStack_270 = auVar20._16_4_;
  fStack_26c = auVar20._20_4_;
  fStack_268 = auVar20._24_4_;
  local_1c0 = fVar43 * (float)local_280._0_4_ + fVar38 * auVar24._0_4_;
  fStack_1bc = fVar33 * (float)local_280._4_4_ + fVar39 * auVar24._4_4_;
  fStack_1b8 = fVar36 * fStack_278 + fVar40 * auVar24._8_4_;
  fStack_1b4 = fVar37 * fStack_274 + fVar41 * auVar24._12_4_;
  fStack_1b0 = fVar43 * fStack_270 + fVar38 * auVar24._16_4_;
  fStack_1ac = fVar33 * fStack_26c + fVar39 * auVar24._20_4_;
  fStack_1a8 = fVar36 * fStack_268 + fVar40 * auVar24._24_4_;
  fStack_1a4 = fVar48 + fStack_1a4;
  local_260._0_4_ = auVar35._0_4_;
  local_260._4_4_ = auVar35._4_4_;
  fStack_258 = auVar35._8_4_;
  fStack_254 = auVar35._12_4_;
  fStack_250 = auVar35._16_4_;
  fStack_24c = auVar35._20_4_;
  fStack_248 = auVar35._24_4_;
  local_280._0_4_ = fVar43 * (float)local_260._0_4_ + fVar38 * auVar47._0_4_;
  local_280._4_4_ = fVar33 * (float)local_260._4_4_ + fVar39 * auVar47._4_4_;
  fStack_278 = fVar36 * fStack_258 + fVar40 * auVar47._8_4_;
  fStack_274 = fVar37 * fStack_254 + fVar41 * auVar47._12_4_;
  fStack_270 = fVar43 * fStack_250 + fVar38 * auVar47._16_4_;
  fStack_26c = fVar33 * fStack_24c + fVar39 * auVar47._20_4_;
  fStack_268 = fVar36 * fStack_248 + fVar40 * auVar47._24_4_;
  register0x000015dc = fVar48 + auVar18._28_4_;
  local_240 = auVar17._0_4_;
  fStack_23c = auVar17._4_4_;
  fStack_238 = auVar17._8_4_;
  fStack_234 = auVar17._12_4_;
  fStack_230 = auVar17._16_4_;
  fStack_22c = auVar17._20_4_;
  fStack_228 = auVar17._24_4_;
  local_180 = fVar43 * local_240 + auVar44._0_4_;
  fStack_17c = fVar33 * fStack_23c + auVar44._4_4_;
  fStack_178 = fVar36 * fStack_238 + auVar44._8_4_;
  fStack_174 = fVar37 * fStack_234 + auVar44._12_4_;
  fStack_170 = fVar43 * fStack_230 + fVar38 * auVar21._16_4_;
  fStack_16c = fVar33 * fStack_22c + fVar39 * auVar21._20_4_;
  fStack_168 = fVar36 * fStack_228 + fVar40 * auVar21._24_4_;
  fStack_164 = fVar48 + auVar34._28_4_;
  auVar44 = vpcmpeqd_avx(auVar44,auVar44);
  auVar15 = vpcmpeqd_avx(auVar44,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar44 = vpcmpeqd_avx(auVar44,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_160._16_16_ = auVar44;
  local_160._0_16_ = auVar15;
  local_130 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
  local_140 = local_130;
  fVar43 = (pre->ray_space).vy.field_0.m128[0];
  fStack_23c = (pre->ray_space).vy.field_0.m128[1];
  local_240 = fStack_23c;
  fStack_238 = fStack_23c;
  fStack_234 = fStack_23c;
  fStack_230 = fStack_23c;
  fStack_22c = fStack_23c;
  fStack_228 = fStack_23c;
  fStack_224 = fStack_23c;
  fVar33 = (pre->ray_space).vz.field_0.m128[0];
  fVar36 = (pre->ray_space).vz.field_0.m128[1];
  fVar37 = *(float *)((long)&(ray->org).field_0 + 4);
  auVar79._4_4_ = fVar37;
  auVar79._0_4_ = fVar37;
  auVar79._8_4_ = fVar37;
  auVar79._12_4_ = fVar37;
  auVar79._16_4_ = fVar37;
  auVar79._20_4_ = fVar37;
  auVar79._24_4_ = fVar37;
  auVar79._28_4_ = fVar37;
  uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar34._4_4_ = uVar30;
  auVar34._0_4_ = uVar30;
  auVar34._8_4_ = uVar30;
  auVar34._12_4_ = uVar30;
  auVar34._16_4_ = uVar30;
  auVar34._20_4_ = uVar30;
  auVar34._24_4_ = uVar30;
  auVar34._28_4_ = uVar30;
  auVar16 = vsubps_avx(auVar75,auVar79);
  auVar17 = vsubps_avx(local_1e0,auVar34);
  fVar82 = auVar17._0_4_;
  fVar83 = auVar17._4_4_;
  fVar84 = auVar17._8_4_;
  fVar88 = auVar17._12_4_;
  fVar89 = auVar17._16_4_;
  fVar90 = auVar17._20_4_;
  fVar91 = auVar17._24_4_;
  fVar49 = auVar16._0_4_;
  fVar50 = auVar16._4_4_;
  fVar51 = auVar16._8_4_;
  fVar52 = auVar16._12_4_;
  fVar53 = auVar16._16_4_;
  fVar55 = auVar16._20_4_;
  fVar58 = auVar16._24_4_;
  fVar38 = (pre->ray_space).vy.field_0.m128[2];
  fVar39 = (pre->ray_space).vz.field_0.m128[2];
  fVar40 = (pre->ray_space).vx.field_0.m128[0];
  fVar41 = *(float *)&(ray->org).field_0;
  auVar72._4_4_ = fVar41;
  auVar72._0_4_ = fVar41;
  auVar72._8_4_ = fVar41;
  auVar72._12_4_ = fVar41;
  auVar72._16_4_ = fVar41;
  auVar72._20_4_ = fVar41;
  auVar72._24_4_ = fVar41;
  auVar72._28_4_ = fVar41;
  auVar22._4_4_ = fStack_29c;
  auVar22._0_4_ = fVar54;
  auVar22._8_4_ = fStack_298;
  auVar22._12_4_ = fStack_294;
  auVar22._16_4_ = fStack_290;
  auVar22._20_4_ = fStack_28c;
  auVar22._24_4_ = fStack_288;
  auVar22._28_4_ = fStack_284;
  auVar18 = vsubps_avx(auVar22,auVar72);
  fVar59 = auVar18._0_4_;
  fVar60 = auVar18._4_4_;
  fVar61 = auVar18._8_4_;
  fVar62 = auVar18._12_4_;
  fVar63 = auVar18._16_4_;
  fVar80 = auVar18._20_4_;
  fVar81 = auVar18._24_4_;
  auVar57._0_4_ = fVar59 * fVar40 + fVar82 * fVar33 + fVar43 * fVar49;
  auVar57._4_4_ = fVar60 * fVar40 + fVar83 * fVar33 + fVar43 * fVar50;
  auVar57._8_4_ = fVar61 * fVar40 + fVar84 * fVar33 + fVar43 * fVar51;
  auVar57._12_4_ = fVar62 * fVar40 + fVar88 * fVar33 + fVar43 * fVar52;
  auVar57._16_4_ = fVar63 * fVar40 + fVar89 * fVar33 + fVar43 * fVar53;
  auVar57._20_4_ = fVar80 * fVar40 + fVar90 * fVar33 + fVar43 * fVar55;
  auVar57._24_4_ = fVar81 * fVar40 + fVar91 * fVar33 + fVar43 * fVar58;
  auVar57._28_4_ = auVar17._28_4_ + auVar21._28_4_ + local_1e0._28_4_;
  fVar42 = (pre->ray_space).vx.field_0.m128[1];
  auVar77._0_4_ = fVar49 * fStack_23c + fVar36 * fVar82 + fVar42 * fVar59;
  auVar77._4_4_ = fVar50 * fStack_23c + fVar36 * fVar83 + fVar42 * fVar60;
  auVar77._8_4_ = fVar51 * fStack_23c + fVar36 * fVar84 + fVar42 * fVar61;
  auVar77._12_4_ = fVar52 * fStack_23c + fVar36 * fVar88 + fVar42 * fVar62;
  auVar77._16_4_ = fVar53 * fStack_23c + fVar36 * fVar89 + fVar42 * fVar63;
  auVar77._20_4_ = fVar55 * fStack_23c + fVar36 * fVar90 + fVar42 * fVar80;
  auVar77._24_4_ = fVar58 * fStack_23c + fVar36 * fVar91 + fVar42 * fVar81;
  auVar77._28_4_ = fVar48 + auVar21._28_4_ + fStack_284;
  fVar48 = (pre->ray_space).vx.field_0.m128[2];
  auVar93._0_4_ = fVar59 * fVar48 + fVar49 * fVar38 + fVar82 * fVar39;
  auVar93._4_4_ = fVar60 * fVar48 + fVar50 * fVar38 + fVar83 * fVar39;
  auVar93._8_4_ = fVar61 * fVar48 + fVar51 * fVar38 + fVar84 * fVar39;
  auVar93._12_4_ = fVar62 * fVar48 + fVar52 * fVar38 + fVar88 * fVar39;
  auVar93._16_4_ = fVar63 * fVar48 + fVar53 * fVar38 + fVar89 * fVar39;
  auVar93._20_4_ = fVar80 * fVar48 + fVar55 * fVar38 + fVar90 * fVar39;
  auVar93._24_4_ = fVar81 * fVar48 + fVar58 * fVar38 + fVar91 * fVar39;
  auVar93._28_4_ = auVar18._28_4_ + auVar16._28_4_ + auVar17._28_4_;
  auVar16 = vsubps_avx(_local_280,auVar34);
  fVar49 = auVar16._0_4_;
  fVar52 = auVar16._4_4_;
  fVar58 = auVar16._8_4_;
  fVar61 = auVar16._12_4_;
  fVar80 = auVar16._16_4_;
  fVar83 = auVar16._20_4_;
  fVar89 = auVar16._24_4_;
  auVar24._4_4_ = fStack_19c;
  auVar24._0_4_ = local_1a0;
  auVar24._8_4_ = fStack_198;
  auVar24._12_4_ = fStack_194;
  auVar24._16_4_ = fStack_190;
  auVar24._20_4_ = fStack_18c;
  auVar24._24_4_ = fStack_188;
  auVar24._28_4_ = fStack_184;
  auVar23._4_4_ = fStack_1bc;
  auVar23._0_4_ = local_1c0;
  auVar23._8_4_ = fStack_1b8;
  auVar23._12_4_ = fStack_1b4;
  auVar23._16_4_ = fStack_1b0;
  auVar23._20_4_ = fStack_1ac;
  auVar23._24_4_ = fStack_1a8;
  auVar23._28_4_ = fStack_1a4;
  auVar17 = vsubps_avx(auVar23,auVar79);
  fVar50 = auVar17._0_4_;
  fVar53 = auVar17._4_4_;
  fVar59 = auVar17._8_4_;
  fVar62 = auVar17._12_4_;
  fVar81 = auVar17._16_4_;
  fVar84 = auVar17._20_4_;
  fVar90 = auVar17._24_4_;
  auVar95 = vsubps_avx(auVar24,auVar72);
  fVar51 = auVar95._0_4_;
  fVar55 = auVar95._4_4_;
  fVar60 = auVar95._8_4_;
  fVar63 = auVar95._12_4_;
  fVar82 = auVar95._16_4_;
  fVar88 = auVar95._20_4_;
  fVar91 = auVar95._24_4_;
  auVar45._0_4_ = fVar40 * fVar51 + fVar43 * fVar50 + fVar33 * fVar49;
  auVar45._4_4_ = fVar40 * fVar55 + fVar43 * fVar53 + fVar33 * fVar52;
  auVar45._8_4_ = fVar40 * fVar60 + fVar43 * fVar59 + fVar33 * fVar58;
  auVar45._12_4_ = fVar40 * fVar63 + fVar43 * fVar62 + fVar33 * fVar61;
  auVar45._16_4_ = fVar40 * fVar82 + fVar43 * fVar81 + fVar33 * fVar80;
  auVar45._20_4_ = fVar40 * fVar88 + fVar43 * fVar84 + fVar33 * fVar83;
  auVar45._24_4_ = fVar40 * fVar91 + fVar43 * fVar90 + fVar33 * fVar89;
  auVar45._28_4_ = auVar17._28_4_ + fVar43 + fVar33;
  auVar69._0_4_ = fVar50 * fStack_23c + fVar36 * fVar49 + fVar42 * fVar51;
  auVar69._4_4_ = fVar53 * fStack_23c + fVar36 * fVar52 + fVar42 * fVar55;
  auVar69._8_4_ = fVar59 * fStack_23c + fVar36 * fVar58 + fVar42 * fVar60;
  auVar69._12_4_ = fVar62 * fStack_23c + fVar36 * fVar61 + fVar42 * fVar63;
  auVar69._16_4_ = fVar81 * fStack_23c + fVar36 * fVar80 + fVar42 * fVar82;
  auVar69._20_4_ = fVar84 * fStack_23c + fVar36 * fVar83 + fVar42 * fVar88;
  auVar69._24_4_ = fVar90 * fStack_23c + fVar36 * fVar89 + fVar42 * fVar91;
  auVar69._28_4_ = fVar37 + auVar18._28_4_ + auVar17._28_4_;
  auVar35._0_4_ = fVar48 * fVar51 + fVar38 * fVar50 + fVar39 * fVar49;
  auVar35._4_4_ = fVar48 * fVar55 + fVar38 * fVar53 + fVar39 * fVar52;
  auVar35._8_4_ = fVar48 * fVar60 + fVar38 * fVar59 + fVar39 * fVar58;
  auVar35._12_4_ = fVar48 * fVar63 + fVar38 * fVar62 + fVar39 * fVar61;
  auVar35._16_4_ = fVar48 * fVar82 + fVar38 * fVar81 + fVar39 * fVar80;
  auVar35._20_4_ = fVar48 * fVar88 + fVar38 * fVar84 + fVar39 * fVar83;
  auVar35._24_4_ = fVar48 * fVar91 + fVar38 * fVar90 + fVar39 * fVar89;
  auVar35._28_4_ = auVar95._28_4_ + fVar38 + auVar16._28_4_;
  auVar17 = vsubps_avx(auVar45,auVar57);
  auVar16 = vsubps_avx(auVar69,auVar77);
  fVar55 = auVar16._0_4_;
  fVar58 = auVar16._4_4_;
  auVar18._4_4_ = fVar58 * -auVar77._4_4_;
  auVar18._0_4_ = fVar55 * -auVar77._0_4_;
  fVar59 = auVar16._8_4_;
  auVar18._8_4_ = fVar59 * -auVar77._8_4_;
  fVar60 = auVar16._12_4_;
  auVar18._12_4_ = fVar60 * -auVar77._12_4_;
  fVar61 = auVar16._16_4_;
  auVar18._16_4_ = fVar61 * -auVar77._16_4_;
  fVar62 = auVar16._20_4_;
  auVar18._20_4_ = fVar62 * -auVar77._20_4_;
  fVar63 = auVar16._24_4_;
  auVar18._24_4_ = fVar63 * -auVar77._24_4_;
  auVar18._28_4_ = -auVar77._28_4_;
  fVar43 = auVar17._0_4_;
  fVar33 = auVar17._4_4_;
  auVar16._4_4_ = auVar57._4_4_ * fVar33;
  auVar16._0_4_ = auVar57._0_4_ * fVar43;
  fVar36 = auVar17._8_4_;
  auVar16._8_4_ = auVar57._8_4_ * fVar36;
  fVar37 = auVar17._12_4_;
  auVar16._12_4_ = auVar57._12_4_ * fVar37;
  fVar38 = auVar17._16_4_;
  auVar16._16_4_ = auVar57._16_4_ * fVar38;
  fVar39 = auVar17._20_4_;
  auVar16._20_4_ = auVar57._20_4_ * fVar39;
  fVar42 = auVar17._24_4_;
  auVar16._24_4_ = auVar57._24_4_ * fVar42;
  auVar16._28_4_ = fVar40;
  auVar18 = vsubps_avx(auVar18,auVar16);
  auVar71._8_4_ = 0x3f800000;
  auVar71._0_8_ = &DAT_3f8000003f800000;
  auVar71._12_4_ = 0x3f800000;
  auVar71._16_4_ = 0x3f800000;
  auVar71._20_4_ = 0x3f800000;
  auVar71._24_4_ = 0x3f800000;
  auVar71._28_4_ = 0x3f800000;
  auVar73._0_4_ = fVar43 * fVar43 + fVar55 * fVar55;
  auVar73._4_4_ = fVar33 * fVar33 + fVar58 * fVar58;
  auVar73._8_4_ = fVar36 * fVar36 + fVar59 * fVar59;
  auVar73._12_4_ = fVar37 * fVar37 + fVar60 * fVar60;
  auVar73._16_4_ = fVar38 * fVar38 + fVar61 * fVar61;
  auVar73._20_4_ = fVar39 * fVar39 + fVar62 * fVar62;
  auVar73._24_4_ = fVar42 * fVar42 + fVar63 * fVar63;
  auVar73._28_4_ = fVar48 + fVar41;
  auVar16 = vrcpps_avx(auVar73);
  fVar40 = auVar16._0_4_;
  fVar41 = auVar16._4_4_;
  auVar95._4_4_ = fVar41 * auVar73._4_4_;
  auVar95._0_4_ = fVar40 * auVar73._0_4_;
  fVar48 = auVar16._8_4_;
  auVar95._8_4_ = fVar48 * auVar73._8_4_;
  fVar49 = auVar16._12_4_;
  auVar95._12_4_ = fVar49 * auVar73._12_4_;
  fVar50 = auVar16._16_4_;
  auVar95._16_4_ = fVar50 * auVar73._16_4_;
  fVar51 = auVar16._20_4_;
  auVar95._20_4_ = fVar51 * auVar73._20_4_;
  fVar52 = auVar16._24_4_;
  auVar95._24_4_ = fVar52 * auVar73._24_4_;
  auVar95._28_4_ = auVar73._28_4_;
  auVar16 = vsubps_avx(auVar71,auVar95);
  auVar20._4_4_ = auVar18._4_4_ * (fVar41 + fVar41 * auVar16._4_4_);
  auVar20._0_4_ = auVar18._0_4_ * (fVar40 + fVar40 * auVar16._0_4_);
  auVar20._8_4_ = auVar18._8_4_ * (fVar48 + fVar48 * auVar16._8_4_);
  auVar20._12_4_ = auVar18._12_4_ * (fVar49 + fVar49 * auVar16._12_4_);
  auVar20._16_4_ = auVar18._16_4_ * (fVar50 + fVar50 * auVar16._16_4_);
  auVar20._20_4_ = auVar18._20_4_ * (fVar51 + fVar51 * auVar16._20_4_);
  auVar20._24_4_ = auVar18._24_4_ * (fVar52 + fVar52 * auVar16._24_4_);
  auVar20._28_4_ = auVar18._28_4_;
  auVar16 = vminps_avx(auVar20,auVar71);
  auVar95 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar16,auVar95);
  fVar40 = local_120._0_4_;
  fVar41 = local_120._4_4_;
  fVar80 = local_120._8_4_;
  fVar81 = local_120._12_4_;
  fVar82 = local_120._16_4_;
  fVar83 = local_120._20_4_;
  fVar84 = local_120._24_4_;
  fVar43 = auVar57._0_4_ + fVar40 * fVar43;
  fVar48 = auVar57._4_4_ + fVar41 * fVar33;
  fVar49 = auVar57._8_4_ + fVar80 * fVar36;
  fVar50 = auVar57._12_4_ + fVar81 * fVar37;
  fVar51 = auVar57._16_4_ + fVar82 * fVar38;
  fVar52 = auVar57._20_4_ + fVar83 * fVar39;
  fVar53 = auVar57._24_4_ + fVar84 * fVar42;
  fVar55 = auVar77._0_4_ + fVar40 * fVar55;
  fVar58 = auVar77._4_4_ + fVar41 * fVar58;
  fVar59 = auVar77._8_4_ + fVar80 * fVar59;
  fVar60 = auVar77._12_4_ + fVar81 * fVar60;
  fVar61 = auVar77._16_4_ + fVar82 * fVar61;
  fVar62 = auVar77._20_4_ + fVar83 * fVar62;
  fVar63 = auVar77._24_4_ + fVar84 * fVar63;
  auVar16 = vsubps_avx(auVar35,auVar93);
  local_e0._0_4_ = auVar93._0_4_ + fVar40 * auVar16._0_4_;
  local_e0._4_4_ = auVar93._4_4_ + fVar41 * auVar16._4_4_;
  local_e0._8_4_ = auVar93._8_4_ + fVar80 * auVar16._8_4_;
  local_e0._12_4_ = auVar93._12_4_ + fVar81 * auVar16._12_4_;
  local_e0._16_4_ = auVar93._16_4_ + fVar82 * auVar16._16_4_;
  local_e0._20_4_ = auVar93._20_4_ + fVar83 * auVar16._20_4_;
  local_e0._24_4_ = auVar93._24_4_ + fVar84 * auVar16._24_4_;
  local_e0._28_4_ = auVar93._28_4_ + auVar16._28_4_;
  auVar19._4_4_ = fStack_17c;
  auVar19._0_4_ = local_180;
  auVar19._8_4_ = fStack_178;
  auVar19._12_4_ = fStack_174;
  auVar19._16_4_ = fStack_170;
  auVar19._20_4_ = fStack_16c;
  auVar19._24_4_ = fStack_168;
  auVar19._28_4_ = fStack_164;
  auVar16 = vsubps_avx(auVar19,_local_220);
  fVar33 = (float)local_220._0_4_ + fVar40 * auVar16._0_4_;
  fVar36 = (float)local_220._4_4_ + fVar41 * auVar16._4_4_;
  fVar37 = fStack_218 + fVar80 * auVar16._8_4_;
  fVar38 = fStack_214 + fVar81 * auVar16._12_4_;
  fVar39 = (float)uStack_210 + fVar82 * auVar16._16_4_;
  fVar40 = uStack_210._4_4_ + fVar83 * auVar16._20_4_;
  fVar41 = (float)uStack_208 + fVar84 * auVar16._24_4_;
  fVar42 = uStack_208._4_4_ + auVar16._28_4_;
  auVar46._0_4_ = fVar43 * fVar43 + fVar55 * fVar55;
  auVar46._4_4_ = fVar48 * fVar48 + fVar58 * fVar58;
  auVar46._8_4_ = fVar49 * fVar49 + fVar59 * fVar59;
  auVar46._12_4_ = fVar50 * fVar50 + fVar60 * fVar60;
  auVar46._16_4_ = fVar51 * fVar51 + fVar61 * fVar61;
  auVar46._20_4_ = fVar52 * fVar52 + fVar62 * fVar62;
  auVar46._24_4_ = fVar53 * fVar53 + fVar63 * fVar63;
  auVar46._28_4_ = auVar57._28_4_ + auVar17._28_4_ + auVar77._28_4_ + auVar57._28_4_;
  auVar17._4_4_ = fVar36 * fVar36;
  auVar17._0_4_ = fVar33 * fVar33;
  auVar17._8_4_ = fVar37 * fVar37;
  auVar17._12_4_ = fVar38 * fVar38;
  auVar17._16_4_ = fVar39 * fVar39;
  auVar17._20_4_ = fVar40 * fVar40;
  auVar17._24_4_ = fVar41 * fVar41;
  auVar17._28_4_ = auVar77._28_4_ + auVar57._28_4_;
  uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar66._4_4_ = uVar30;
  auVar66._0_4_ = uVar30;
  auVar66._8_4_ = uVar30;
  auVar66._12_4_ = uVar30;
  auVar66._16_4_ = uVar30;
  auVar66._20_4_ = uVar30;
  auVar66._24_4_ = uVar30;
  auVar66._28_4_ = uVar30;
  auVar17 = vcmpps_avx(auVar46,auVar17,2);
  auVar16 = vcmpps_avx(auVar66,local_e0,2);
  fVar43 = ray->tfar;
  auVar67._4_4_ = fVar43;
  auVar67._0_4_ = fVar43;
  auVar67._8_4_ = fVar43;
  auVar67._12_4_ = fVar43;
  auVar67._16_4_ = fVar43;
  auVar67._20_4_ = fVar43;
  auVar67._24_4_ = fVar43;
  auVar67._28_4_ = fVar43;
  auVar18 = vcmpps_avx(local_e0,auVar67,2);
  auVar16 = vandps_avx(auVar18,auVar16);
  fVar43 = pre->depth_scale;
  auVar16 = vandps_avx(auVar16,auVar17);
  auVar21._4_4_ = fVar43 * (fVar36 + fVar36);
  auVar21._0_4_ = fVar43 * (fVar33 + fVar33);
  auVar21._8_4_ = fVar43 * (fVar37 + fVar37);
  auVar21._12_4_ = fVar43 * (fVar38 + fVar38);
  auVar21._16_4_ = fVar43 * (fVar39 + fVar39);
  auVar21._20_4_ = fVar43 * (fVar40 + fVar40);
  auVar21._24_4_ = fVar43 * (fVar41 + fVar41);
  auVar21._28_4_ = fVar42 + fVar42;
  auVar17 = vcmpps_avx(local_e0,auVar21,6);
  auVar16 = vandps_avx(auVar17,auVar16);
  auVar44 = vpslld_avx(auVar16._0_16_,0x1f);
  auVar47._0_16_ = vpsrad_avx(auVar44,0x1f);
  auVar44 = vpslld_avx(auVar16._16_16_,0x1f);
  auVar44 = vpsrad_avx(auVar44,0x1f);
  auVar47._16_16_ = auVar44;
  auVar16 = auVar47 & ~local_160;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vandnps_avx(local_160,auVar47);
    auVar25._4_4_ = fStack_29c;
    auVar25._0_4_ = fVar54;
    auVar25._8_4_ = fStack_298;
    auVar25._12_4_ = fStack_294;
    auVar25._16_4_ = fStack_290;
    auVar25._20_4_ = fStack_28c;
    auVar25._24_4_ = fStack_288;
    auVar25._28_4_ = fStack_284;
    local_c0 = vsubps_avx(auVar24,auVar25);
    local_a0 = vsubps_avx(auVar23,auVar75);
    local_80[0] = vsubps_avx(_local_280,local_1e0);
    auVar17 = vcmpps_avx(auVar95,local_c0,4);
    auVar95 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar18 = vcmpps_avx(auVar95,local_a0,4);
    auVar18 = vorps_avx(auVar17,auVar18);
    auVar17 = vcmpps_avx(auVar95,local_80[0],4);
    auVar17 = vorps_avx(auVar18,auVar17);
    auVar18 = auVar16 & auVar17;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar16 = vandps_avx(auVar17,auVar16);
      local_100 = ZEXT832(0) << 0x20;
      uVar30 = vmovmskps_avx(auVar16);
      uVar32 = CONCAT44((int)((ulong)lVar31 >> 0x20),uVar30);
      local_330 = pSVar29;
      local_328 = ray;
      local_2e8 = context;
      _local_260 = auVar75;
      do {
        local_2d0.hit = (RTCHitN *)&local_320;
        local_2d0.valid = &local_334;
        uVar28 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        local_308 = *(uint *)(local_140 + uVar28 * 4);
        pGVar11 = (pSVar29->geometries).items[local_308].ptr;
        if ((pGVar11->mask & ray->mask) == 0) {
LAB_011dd4d5:
          uVar32 = uVar32 ^ 1L << (uVar28 & 0x3f);
          bVar26 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_314 = *(undefined4 *)(local_120 + uVar28 * 4);
            local_310 = *(undefined4 *)(local_100 + uVar28 * 4);
            local_30c = (line->primIDs).field_0.i[uVar28];
            local_320 = *(undefined4 *)(local_c0 + uVar28 * 4);
            local_31c = *(undefined4 *)(local_a0 + uVar28 * 4);
            local_318 = *(undefined4 *)(local_80[0] + uVar28 * 4);
            local_304 = context->user->instID[0];
            local_300 = context->user->instPrimID[0];
            local_2a0 = ray->tfar;
            ray->tfar = *(float *)(local_e0 + uVar28 * 4);
            local_334 = -1;
            local_2d0.geometryUserPtr = pGVar11->userPtr;
            local_2d0.context = context->user;
            local_2d0.N = 1;
            local_2d0.ray = (RTCRayN *)ray;
            if ((pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar11->occlusionFilterN)(&local_2d0), ray = local_328, pSVar29 = local_330,
               *local_2d0.valid == 0)) {
LAB_011dd626:
              ray->tfar = local_2a0;
              goto LAB_011dd4d5;
            }
            p_Var14 = context->args->filter;
            if (p_Var14 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var14)(&local_2d0);
                ray = local_328;
                pSVar29 = local_330;
              }
              if (*local_2d0.valid == 0) goto LAB_011dd626;
            }
          }
          bVar26 = 0;
        }
        if ((bVar26 == 0) || (uVar32 == 0)) {
          return (bool)(bVar26 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time());
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }